

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O0

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::
test_method(generic_catcher_with_custom_action_which_return_fail_code *this)

{
  undefined1 in_R8B;
  GenericExceptionHandler<int,_mittens::UnHandler<double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:204:51)>
  intCatcher_2;
  GenericExceptionHandler<int,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:191:68)>
  intCatcher_1;
  undefined1 local_128 [8];
  GenericExceptionHandler<int,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:178:68)>
  intCatcher;
  int EXPECTED_RETURN_VALUE_1;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:164:69)>
  allCatcher_1;
  undefined1 local_30 [8];
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:151:69)>
  allCatcher;
  int EXPECTED_RETURN_VALUE;
  int DEFAULT_RETURN_VALUE;
  generic_catcher_with_custom_action_which_return_fail_code *this_local;
  
  allCatcher._20_4_ = 0;
  allCatcher.supressExceptionsInAction_ = true;
  allCatcher._17_3_ = 0;
  mittens::
  generic_handler<void,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::test_method()::__0,int>
            ((GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:151:69)>
              *)local_30,(mittens *)0x0,(int)&allCatcher + 0x10,
             (anon_class_8_1_5d0b34c9_for_customAction_)0x1,(bool)in_R8B);
  throw_int(0);
  mittens::
  generic_handler<void,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::test_method()::__1,int>
            (allCatcher._20_4_,1);
  throw_int(0);
  intCatcher.supressExceptionsInAction_ = true;
  intCatcher._17_3_ = 0;
  mittens::
  generic_handler<int,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::test_method()::__2,int>
            ((GenericExceptionHandler<int,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:178:68)>
              *)local_128,(mittens *)(ulong)(uint)allCatcher._20_4_,(int)&intCatcher + 0x10,
             (anon_class_8_1_5d0b34c9_for_customAction_)0x1,(bool)in_R8B);
  throw_int(0);
  mittens::
  generic_handler<int,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::test_method()::__3,int>
            (allCatcher._20_4_,1);
  throw_int(0);
  mittens::
  generic_handler<int,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::test_method()::__4,double>
            (0x3fb999999999999a);
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_with_custom_action_which_return_fail_code)
{
   int DEFAULT_RETURN_VALUE  = 0;
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(0.1, [&](int&) { return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(2.5, intCatcher.handleException());
         }
      }
   }
}